

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRestruct.c
# Opt level: O2

int Abc_Abc_NodeResubCollectDivs(Abc_ManRst_t *p,Abc_Obj_t *pRoot,Cut_Cut_t *pCut)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  long *plVar3;
  ulong uVar4;
  long lVar5;
  int i;
  
  p->vDecs->nSize = 0;
  Abc_NtkIncrementTravId(pRoot->pNtk);
  uVar4 = 0;
  while( true ) {
    if (*(uint *)pCut >> 0x1c <= uVar4) {
      for (i = 0; i < p->vDecs->nSize; i = i + 1) {
        plVar3 = (long *)Vec_PtrEntry(p->vDecs,i);
        for (lVar5 = 0; lVar5 < *(int *)((long)plVar3 + 0x2c); lVar5 = lVar5 + 1) {
          pAVar2 = *(Abc_Obj_t **)
                    (*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                    (long)*(int *)(plVar3[6] + lVar5 * 4) * 8);
          iVar1 = Abc_NodeIsTravIdCurrent(pAVar2);
          if ((((iVar1 == 0) && ((*(uint *)&pAVar2->field_0x14 & 0xf) != 3)) &&
              (iVar1 = Abc_NodeIsTravIdCurrent
                                 ((Abc_Obj_t *)
                                  pAVar2->pNtk->vObjs->pArray[*(pAVar2->vFanins).pArray]),
              iVar1 != 0)) &&
             (iVar1 = Abc_NodeIsTravIdCurrent
                                ((Abc_Obj_t *)
                                 pAVar2->pNtk->vObjs->pArray[(pAVar2->vFanins).pArray[1]]),
             iVar1 != 0)) {
            Vec_PtrPush(p->vDecs,pAVar2);
            Abc_NodeSetTravIdCurrent(pAVar2);
          }
        }
      }
      return 1;
    }
    pAVar2 = Abc_NtkObj(pRoot->pNtk,*(int *)(&pCut[1].field_0x0 + uVar4 * 4));
    if (pAVar2 == (Abc_Obj_t *)0x0) break;
    Vec_PtrPush(p->vDecs,pAVar2);
    Abc_NodeSetTravIdCurrent(pAVar2);
    uVar4 = uVar4 + 1;
  }
  return 0;
}

Assistant:

int Abc_Abc_NodeResubCollectDivs( Abc_ManRst_t * p, Abc_Obj_t * pRoot, Cut_Cut_t * pCut )
{
    Abc_Obj_t * pNode, * pFanout;
    int i, k;
    // collect the leaves of the cut
    Vec_PtrClear( p->vDecs );
    Abc_NtkIncrementTravId( pRoot->pNtk );
    for ( i = 0; i < (int)pCut->nLeaves; i++ )
    {
        pNode = Abc_NtkObj(pRoot->pNtk, pCut->pLeaves[i]);
        if ( pNode == NULL )  // the so-called "bad cut phenomenon" is due to removed nodes
            return 0;
        Vec_PtrPush( p->vDecs, pNode );
        Abc_NodeSetTravIdCurrent( pNode );        
    }
    // explore the fanouts
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vDecs, pNode, i )
    {
        // if the fanout has both fanins in the set, add it
        Abc_ObjForEachFanout( pNode, pFanout, k )
        {
            if ( Abc_NodeIsTravIdCurrent(pFanout) || Abc_ObjIsPo(pFanout) )
                continue;
            if ( Abc_NodeIsTravIdCurrent(Abc_ObjFanin0(pFanout)) && Abc_NodeIsTravIdCurrent(Abc_ObjFanin1(pFanout)) )
            {
                Vec_PtrPush( p->vDecs, pFanout );
                Abc_NodeSetTravIdCurrent( pFanout );     
            }
        }
    }
    return 1;
}